

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanceid_keys.c
# Opt level: O2

LY_ERR lyplg_type_store_instanceid_keys
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *prefix_data,uint32_t hints,lysc_node *UNUSED_ctx_node,
                 lyd_value *storage,lys_glob_unres *UNUSED_unres,ly_err_item **err)

{
  lyxp_token lVar1;
  uint uVar2;
  lysc_range *range;
  lysc_node *plVar3;
  char *pcVar4;
  LY_ERR LVar5;
  ly_path *expr;
  size_t value_00;
  uint32_t *opts;
  ly_err_item *plVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar14;
  char *str_tok;
  uint32_t temp_lo;
  char *local_40;
  lys_module *local_38;
  ulong uVar13;
  
  uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  temp_lo = 2;
  (storage->field_2).dec64 = 0;
  *(undefined8 *)((long)&storage->field_2 + 8) = 0;
  storage->_canonical = (char *)0x0;
  storage->realtype = (lysc_type *)0x0;
  *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
  expr = (ly_path *)calloc(1,0x20);
  (storage->field_2).target = expr;
  if (expr == (ly_path *)0x0) {
    LVar5 = LY_EMEM;
  }
  else {
    storage->realtype = type;
    LVar5 = lyplg_type_check_hints(hints,(char *)value,value_len,type->basetype,(int *)0x0,err);
    if (LVar5 == LY_SUCCESS) {
      range = (lysc_range *)type[1].name;
      if (range != (lysc_range *)0x0) {
        value_00 = ly_utf8len((char *)value,value_len);
        LVar5 = lyplg_type_validate_range(LY_TYPE_STRING,range,value_00,(char *)value,value_len,err)
        ;
        if (LVar5 != LY_SUCCESS) goto LAB_001af36d;
      }
      LVar5 = lyplg_type_validate_patterns
                        ((lysc_pattern **)type[1].exts,(char *)value,value_len,err);
      if (LVar5 == LY_SUCCESS) {
        if (value_len == 0) {
          pcVar9 = "";
        }
        else {
          pcVar9 = (char *)value;
          if (*value != 0x5b) {
            LVar5 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                               "Invalid first character \'%c\', list key predicates expected.",
                               CONCAT44(uVar14,(int)*value));
            goto LAB_001af36d;
          }
        }
        opts = ly_temp_log_options(&temp_lo);
        local_40 = pcVar9;
        LVar5 = ly_path_parse_predicate
                          (ctx,(lysc_node *)0x0,pcVar9,value_len,0x10,0x100,(lyxp_expr **)expr);
        ly_temp_log_options(opts);
        if (LVar5 == LY_SUCCESS) {
          expr->ext = (lysc_ext_instance *)ctx;
          LVar5 = lyplg_type_prefix_data_new
                            (ctx,value,value_len,format,prefix_data,(LY_VALUE_FORMAT *)(expr + 1),
                             &expr->predicates);
          if (LVar5 == LY_SUCCESS) {
            if (format < (LY_VALUE_STR_NS|LY_VALUE_SCHEMA)) {
              if ((0x71U >> (format & 0x1f) & 1) == 0) {
                local_38 = (lys_module *)0x0;
                uVar10 = 0;
                uVar11 = 0;
                pcVar9 = (char *)0x0;
                while( true ) {
                  uVar13 = (ulong)uVar11;
                  plVar3 = expr->node;
                  if (*(uint *)&plVar3->prev <= uVar10) break;
                  lVar1 = (*(lyxp_token **)&plVar3->nodetype)[uVar10];
                  uVar2 = *(uint *)((long)&plVar3->module->ctx + uVar10 * 4);
                  pcVar4 = plVar3->name;
                  if ((lVar1 == LYXP_TOKEN_LITERAL) || (lVar1 == LYXP_TOKEN_NAMETEST)) {
                    LVar5 = lyplg_type_xpath10_print_token
                                      (pcVar4 + uVar2,
                                       *(uint16_t *)(plVar3->parent->hash + uVar10 * 4 + -4),
                                       lVar1 == LYXP_TOKEN_NAMETEST,&local_38,(ly_ctx *)expr->ext,
                                       *(LY_VALUE_FORMAT *)&expr[1].node,expr->predicates,
                                       LY_VALUE_JSON,(void *)0x0,&str_tok,err);
                    if (LVar5 != LY_SUCCESS) goto LAB_001af713;
                    sVar7 = strlen(str_tok);
                    pcVar8 = (char *)realloc(pcVar9,uVar13 + sVar7 + 1);
                    pcVar4 = str_tok;
                    if (pcVar8 == (char *)0x0) {
                      free(str_tok);
                      goto LAB_001af6e5;
                    }
                    pcVar9 = stpcpy(pcVar8 + uVar13,str_tok);
                    iVar12 = (int)pcVar9 - (int)(pcVar8 + uVar13);
                    free(pcVar4);
                  }
                  else {
                    pcVar8 = (char *)realloc(pcVar9,(ulong)(uVar11 + *(int *)(plVar3->parent->hash +
                                                                             uVar10 * 4 + -4) + 1));
                    if (pcVar8 == (char *)0x0) {
LAB_001af6e5:
                      LVar5 = ly_err_new(err,LY_EMEM,LYVE_DATA,(char *)0x0,(char *)0x0,"No memory.")
                      ;
                      if (LVar5 != LY_SUCCESS) {
LAB_001af713:
                        free(pcVar9);
                        goto LAB_001af36d;
                      }
                      break;
                    }
                    iVar12 = sprintf(pcVar8 + uVar13,"%.*s",
                                     (ulong)*(uint *)(expr->node->parent->hash + uVar10 * 4 + -4),
                                     pcVar4 + uVar2);
                  }
                  uVar10 = uVar10 + 1;
                  uVar11 = iVar12 + uVar11;
                  pcVar9 = pcVar8;
                }
                LVar5 = lydict_insert_zc(ctx,pcVar9,&storage->_canonical);
              }
              else {
                if ((options & 1) != 0) {
                  LVar5 = lydict_insert_zc(ctx,(char *)value,&storage->_canonical);
                  goto LAB_001af37c;
                }
                LVar5 = lydict_insert(ctx,local_40,value_len,&storage->_canonical);
              }
            }
            else {
              LVar5 = LY_SUCCESS;
            }
          }
        }
        else {
          plVar6 = ly_err_last(ctx);
          LVar5 = ly_err_new(err,LVar5,LYVE_DATA,plVar6->data_path,(char *)0x0,"%s",plVar6->msg);
          ly_err_clean(ctx,(ly_err_item *)0x0);
        }
      }
    }
  }
LAB_001af36d:
  if ((options & 1) != 0) {
    free(value);
  }
LAB_001af37c:
  if (LVar5 != LY_SUCCESS) {
    lyplg_type_free_xpath10(ctx,storage);
  }
  return LVar5;
}

Assistant:

static LY_ERR
lyplg_type_store_instanceid_keys(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *prefix_data, uint32_t hints, const struct lysc_node *UNUSED(ctx_node),
        struct lyd_value *storage, struct lys_glob_unres *UNUSED(unres), struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_type_str *type_str = (struct lysc_type_str *)type;
    struct lyd_value_instance_identifier_keys *val;
    uint32_t *prev_lo, temp_lo = LY_LOSTORE;
    const struct ly_err_item *eitem;
    char *canon;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, val);
    LY_CHECK_ERR_GOTO(!val, ret = LY_EMEM, cleanup);
    storage->realtype = type;

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* length restriction of the string */
    if (type_str->length) {
        /* value_len is in bytes, but we need number of characters here */
        ret = lyplg_type_validate_range(LY_TYPE_STRING, type_str->length, ly_utf8len(value, value_len), value, value_len, err);
        LY_CHECK_GOTO(ret, cleanup);
    }

    /* pattern restrictions */
    ret = lyplg_type_validate_patterns(type_str->patterns, value, value_len, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* parse instance-identifier keys, with optional prefix even though it should be mandatory */
    if (value_len && (((char *)value)[0] != '[')) {
        ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid first character '%c', list key predicates expected.",
                ((char *)value)[0]);
        goto cleanup;
    }

    /* do not log */
    prev_lo = ly_temp_log_options(&temp_lo);
    ret = ly_path_parse_predicate(ctx, NULL, value_len ? value : "", value_len, LY_PATH_PREFIX_OPTIONAL,
            LY_PATH_PRED_KEYS, &val->keys);
    ly_temp_log_options(prev_lo);
    if (ret) {
        eitem = ly_err_last(ctx);
        ret = ly_err_new(err, ret, LYVE_DATA, eitem->data_path, NULL, "%s", eitem->msg);
        ly_err_clean((struct ly_ctx *)ctx, NULL);
        goto cleanup;
    }
    val->ctx = ctx;

    /* store format-specific data and context for later prefix resolution */
    ret = lyplg_type_prefix_data_new(ctx, value, value_len, format, prefix_data, &val->format, &val->prefix_data);
    LY_CHECK_GOTO(ret, cleanup);

    switch (format) {
    case LY_VALUE_CANON:
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
    case LY_VALUE_STR_NS:
        /* store canonical value */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            ret = lydict_insert(ctx, value_len ? value : "", value_len, &storage->_canonical);
            LY_CHECK_GOTO(ret, cleanup);
        }
        break;
    case LY_VALUE_SCHEMA:
    case LY_VALUE_SCHEMA_RESOLVED:
    case LY_VALUE_XML:
        /* JSON format with prefix is the canonical one */
        ret = instanceid_keys_print_value(val, LY_VALUE_JSON, NULL, &canon, err);
        LY_CHECK_GOTO(ret, cleanup);

        ret = lydict_insert_zc(ctx, canon, &storage->_canonical);
        LY_CHECK_GOTO(ret, cleanup);
        break;
    }

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if (ret) {
        lyplg_type_free_xpath10(ctx, storage);
    }
    return ret;
}